

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_SetButcherTables(ARKodeMem ark_mem)

{
  void *pvVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  ARKodeButcherTable pAVar5;
  ARKODE_ERKTableID emethod;
  ARKODE_DIRKTableID imethod;
  sunindextype Bliw;
  sunindextype Blrw;
  long local_40;
  long local_38;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x88d,"arkStep_SetButcherTables",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  if (*(long *)((long)pvVar1 + 0x68) != 0) {
    return 0;
  }
  if (*(long *)((long)pvVar1 + 0x70) != 0) {
    return 0;
  }
  if ((*(int *)((long)pvVar1 + 0x1c) != 0) && (*(int *)((long)pvVar1 + 0x20) != 0)) {
    bVar3 = true;
    switch(*(undefined4 *)((long)pvVar1 + 0x58)) {
    case 2:
      imethod = ARKODE_ARK2_DIRK_3_1_2;
      emethod = ARKODE_ARK2_ERK_3_1_2;
      break;
    case 3:
      imethod = ARKODE_ARK324L2SA_DIRK_4_2_3;
      emethod = ARKODE_ARK324L2SA_ERK_4_2_3;
      break;
    case 4:
      imethod = ARKODE_ARK436L2SA_DIRK_6_3_4;
      emethod = ARKODE_ARK436L2SA_ERK_6_3_4;
      break;
    default:
      arkProcessError(ark_mem,-0x16,0x8b2,"arkStep_SetButcherTables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                      ,"No ImEx method at requested order, using q=5.");
    case 5:
      imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
      emethod = ARKODE_ARK548L2SA_ERK_8_4_5;
    }
    bVar4 = true;
    goto LAB_00120378;
  }
  if (*(int *)((long)pvVar1 + 0x20) == 0) {
    switch(*(undefined4 *)((long)pvVar1 + 0x58)) {
    case 1:
      imethod = 0x16;
      goto LAB_001202cf;
    case 2:
      emethod = ARKODE_HEUN_EULER_2_1_2;
      break;
    case 3:
      emethod = ARKODE_BOGACKI_SHAMPINE_4_2_3;
      break;
    case 4:
      emethod = ARKODE_ZONNEVELD_5_3_4;
      break;
    case 5:
      emethod = ARKODE_CASH_KARP_6_4_5;
      break;
    case 6:
      emethod = ARKODE_VERNER_8_5_6;
      break;
    case 7:
      emethod = ARKODE_VERNER_10_6_7;
      break;
    case 8:
      emethod = ARKODE_FEHLBERG_13_7_8;
      break;
    case 9:
      emethod = ARKODE_VERNER_16_8_9;
      break;
    default:
      bVar4 = false;
      arkProcessError(ark_mem,-0x16,0x8db,"arkStep_SetButcherTables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                      ,"No explicit method at requested order, using q=9.");
      imethod = ARKODE_DIRK_NONE;
      emethod = ARKODE_VERNER_16_8_9;
      bVar3 = true;
      goto LAB_00120378;
    }
    imethod = ARKODE_DIRK_NONE;
    bVar3 = true;
    bVar4 = false;
  }
  else {
    bVar4 = true;
    switch(*(undefined4 *)((long)pvVar1 + 0x58)) {
    case 1:
      imethod = ARKODE_BACKWARD_EULER_1_1;
      break;
    case 2:
      imethod = ARKODE_MIN_DIRK_NUM;
      break;
    case 3:
      imethod = ARKODE_ARK324L2SA_DIRK_4_2_3;
      break;
    case 4:
      imethod = ARKODE_SDIRK_5_3_4;
      break;
    case 5:
      imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
      break;
    default:
      bVar3 = false;
      arkProcessError(ark_mem,-0x16,0x8c5,"arkStep_SetButcherTables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                      ,"No implicit method at requested order, using q=5.");
      emethod = ARKODE_ERK_NONE;
      imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
      goto LAB_00120378;
    }
LAB_001202cf:
    emethod = ARKODE_ERK_NONE;
    bVar4 = true;
    bVar3 = false;
  }
LAB_00120378:
  if (bVar3) {
    pAVar5 = ARKodeButcherTable_LoadERK(emethod);
    *(ARKodeButcherTable *)((long)pvVar1 + 0x68) = pAVar5;
  }
  if (bVar4) {
    pAVar5 = ARKodeButcherTable_LoadDIRK(imethod);
    *(ARKodeButcherTable *)((long)pvVar1 + 0x70) = pAVar5;
  }
  ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)pvVar1 + 0x68),&local_40,&local_38);
  ark_mem->liw = ark_mem->liw + local_40;
  ark_mem->lrw = ark_mem->lrw + local_38;
  ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)pvVar1 + 0x70),&local_40,&local_38);
  ark_mem->liw = ark_mem->liw + local_40;
  ark_mem->lrw = ark_mem->lrw + local_38;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x68);
  if (puVar2 != (undefined8 *)0x0) {
    *(undefined4 *)((long)pvVar1 + 100) = *(undefined4 *)(puVar2 + 1);
    *(undefined8 *)((long)pvVar1 + 0x58) = *puVar2;
  }
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x70);
  if (puVar2 != (undefined8 *)0x0) {
    *(undefined4 *)((long)pvVar1 + 100) = *(undefined4 *)(puVar2 + 1);
    *(undefined8 *)((long)pvVar1 + 0x58) = *puVar2;
  }
  return 0;
}

Assistant:

int arkStep_SetButcherTables(ARKodeMem ark_mem)
{
  int etable, itable;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* if tables have already been specified, just return */
  if ((step_mem->Be != NULL) || (step_mem->Bi != NULL))
  {
    return (ARK_SUCCESS);
  }

  /* initialize table numbers to illegal values */
  etable = itable = -1;

  /**** ImEx methods ****/
  if (step_mem->explicit && step_mem->implicit)
  {
    switch (step_mem->q)
    {
    case (2):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_2;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_2;
      break;
    case (3):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_3;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_3;
      break;
    case (4):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_4;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_4;
      break;
    case (5):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    default: /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No ImEx method at requested order, using q=5.");
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    }

    /**** implicit methods ****/
  }
  else if (step_mem->implicit)
  {
    switch (step_mem->q)
    {
    case (1): itable = ARKSTEP_DEFAULT_DIRK_1; break;
    case (2): itable = ARKSTEP_DEFAULT_DIRK_2; break;
    case (3): itable = ARKSTEP_DEFAULT_DIRK_3; break;
    case (4): itable = ARKSTEP_DEFAULT_DIRK_4; break;
    case (5): itable = ARKSTEP_DEFAULT_DIRK_5; break;
    default: /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No implicit method at requested order, using q=5.");
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    }

    /**** explicit methods ****/
  }
  else
  {
    switch (step_mem->q)
    {
    case (1): itable = ARKSTEP_DEFAULT_ERK_1; break;
    case (2): etable = ARKSTEP_DEFAULT_ERK_2; break;
    case (3): etable = ARKSTEP_DEFAULT_ERK_3; break;
    case (4): etable = ARKSTEP_DEFAULT_ERK_4; break;
    case (5): etable = ARKSTEP_DEFAULT_ERK_5; break;
    case (6): etable = ARKSTEP_DEFAULT_ERK_6; break;
    case (7): etable = ARKSTEP_DEFAULT_ERK_7; break;
    case (8): etable = ARKSTEP_DEFAULT_ERK_8; break;
    case (9): etable = ARKSTEP_DEFAULT_ERK_9; break;
    default: /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No explicit method at requested order, using q=9.");
      etable = ARKSTEP_DEFAULT_ERK_9;
      break;
    }
  }

  if (etable > -1) { step_mem->Be = ARKodeButcherTable_LoadERK(etable); }
  if (itable > -1) { step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable); }

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] ARK stored values for stage numbers and method orders */
  if (step_mem->Be != NULL)
  {
    step_mem->stages = step_mem->Be->stages;
    step_mem->q      = step_mem->Be->q;
    step_mem->p      = step_mem->Be->p;
  }
  if (step_mem->Bi != NULL)
  {
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q      = step_mem->Bi->q;
    step_mem->p      = step_mem->Bi->p;
  }

  return (ARK_SUCCESS);
}